

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

void __thiscall
icu_63::CollationRuleParser::parseSetting(CollationRuleParser *this,UErrorCode *errorCode)

{
  UnicodeString *pUVar1;
  UBool UVar2;
  char16_t cVar3;
  int32_t iVar4;
  uint32_t uVar5;
  int32_t iVar6;
  int iVar7;
  char *langtag;
  __off_t __length;
  bool bVar8;
  char *local_a80;
  ConstChar16Ptr local_9d0;
  UnicodeString local_9c8;
  ConstChar16Ptr local_988;
  UnicodeString local_980;
  undefined1 local_940 [8];
  UnicodeSet set;
  int32_t outerRuleIndex;
  UnicodeString *outerRules;
  UnicodeString importedRules;
  char collationType [96];
  char baseID [157];
  int local_78c;
  int32_t length;
  int32_t parsedLength;
  char localeID [157];
  undefined1 local_6e0 [8];
  CharString lang;
  UnicodeString local_698;
  UColAttributeValue local_654;
  UColAttributeValue value_7;
  UnicodeString local_648;
  UColAttributeValue local_604;
  UColAttributeValue value_6;
  UnicodeString local_5f8;
  UColAttributeValue local_5b4;
  UColAttributeValue value_5;
  UnicodeString local_5a8;
  UColAttributeValue local_564;
  UColAttributeValue value_4;
  UnicodeString local_558;
  ConstChar16Ptr local_518;
  UnicodeString local_510;
  ConstChar16Ptr local_4d0;
  UnicodeString local_4c8;
  ConstChar16Ptr local_488;
  UnicodeString local_480;
  UColAttributeValue local_43c;
  UColAttributeValue value_3;
  UnicodeString local_430;
  ConstChar16Ptr local_3f0;
  UnicodeString local_3e8;
  ConstChar16Ptr local_3a8;
  UnicodeString local_3a0;
  ConstChar16Ptr local_360;
  UnicodeString local_358;
  ConstChar16Ptr local_318;
  UnicodeString local_310;
  int local_2cc;
  int32_t value_2;
  UnicodeString local_2c0;
  ConstChar16Ptr local_280;
  UnicodeString local_278;
  ConstChar16Ptr local_238;
  UnicodeString local_230;
  UColAttributeValue local_1ec;
  UColAttributeValue value_1;
  UnicodeString local_1e0;
  char16_t local_19e;
  int local_19c;
  UChar c;
  int32_t value;
  UnicodeString local_190;
  uint local_14c;
  undefined1 local_148 [4];
  int32_t valueIndex;
  UnicodeString v;
  UnicodeString local_100;
  int local_bc;
  ConstChar16Ptr local_b8;
  UnicodeString local_b0;
  int32_t local_60;
  int local_5c;
  int32_t j;
  int32_t i;
  UnicodeString raw;
  UErrorCode *errorCode_local;
  CollationRuleParser *this_local;
  
  raw.fUnion._48_8_ = errorCode;
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 != '\0') {
    return;
  }
  UnicodeString::UnicodeString((UnicodeString *)&j);
  local_5c = this->ruleIndex + 1;
  local_60 = readWords(this,local_5c,(UnicodeString *)&j);
  if ((local_60 <= local_5c) || (UVar2 = UnicodeString::isEmpty((UnicodeString *)&j), UVar2 != '\0')
     ) {
    setParseError(this,"expected a setting/option at \'[\'",(UErrorCode *)raw.fUnion._48_8_);
  }
  cVar3 = UnicodeString::charAt(this->rules,local_60);
  if (cVar3 == L']') {
    local_60 = local_60 + 1;
    ConstChar16Ptr::ConstChar16Ptr(&local_b8,L"reorder");
    UnicodeString::UnicodeString(&local_b0,'\x01',&local_b8,-1);
    UVar2 = UnicodeString::startsWith((UnicodeString *)&j,&local_b0);
    bVar8 = false;
    if (UVar2 != '\0') {
      iVar4 = UnicodeString::length((UnicodeString *)&j);
      bVar8 = true;
      if (iVar4 != 7) {
        cVar3 = UnicodeString::charAt((UnicodeString *)&j,7);
        bVar8 = cVar3 == L' ';
      }
    }
    UnicodeString::~UnicodeString(&local_b0);
    ConstChar16Ptr::~ConstChar16Ptr(&local_b8);
    if (bVar8) {
      parseReordering(this,(UnicodeString *)&j,(UErrorCode *)raw.fUnion._48_8_);
      this->ruleIndex = local_60;
      local_bc = 1;
      goto LAB_00299816;
    }
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)((long)&v.fUnion + 0x30),L"backwards 2");
    UnicodeString::UnicodeString(&local_100,'\x01',(ConstChar16Ptr *)((long)&v.fUnion + 0x30),-1);
    UVar2 = UnicodeString::operator==((UnicodeString *)&j,&local_100);
    UnicodeString::~UnicodeString(&local_100);
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)((long)&v.fUnion + 0x30));
    if (UVar2 != '\0') {
      CollationSettings::setFlag(this->settings,0x800,UCOL_ON,0,(UErrorCode *)raw.fUnion._48_8_);
      this->ruleIndex = local_60;
      local_bc = 1;
      goto LAB_00299816;
    }
    UnicodeString::UnicodeString((UnicodeString *)local_148);
    local_14c = UnicodeString::lastIndexOf((UnicodeString *)&j,L' ');
    if (-1 < (int)local_14c) {
      UnicodeString::setTo((UnicodeString *)local_148,(UnicodeString *)&j,local_14c + 1);
      UnicodeString::truncate((UnicodeString *)&j,(char *)(ulong)local_14c,__length);
    }
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffe68,L"strength");
    UnicodeString::UnicodeString(&local_190,'\x01',(ConstChar16Ptr *)&stack0xfffffffffffffe68,-1);
    UVar2 = UnicodeString::operator==((UnicodeString *)&j,&local_190);
    bVar8 = false;
    if (UVar2 != '\0') {
      iVar4 = UnicodeString::length((UnicodeString *)local_148);
      bVar8 = iVar4 == 1;
    }
    UnicodeString::~UnicodeString(&local_190);
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffe68);
    if (bVar8) {
      local_19c = -1;
      local_19e = UnicodeString::charAt((UnicodeString *)local_148,0);
      if (((ushort)local_19e < 0x31) || (0x34 < (ushort)local_19e)) {
        if (local_19e == L'I') {
          local_19c = 0xf;
        }
      }
      else {
        local_19c = (ushort)local_19e - 0x31;
      }
      if (local_19c == -1) goto LAB_002994b4;
      CollationSettings::setStrength(this->settings,local_19c,0,(UErrorCode *)raw.fUnion._48_8_);
      this->ruleIndex = local_60;
      local_bc = 1;
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffe18,L"alternate");
      UnicodeString::UnicodeString(&local_1e0,'\x01',(ConstChar16Ptr *)&stack0xfffffffffffffe18,-1);
      UVar2 = UnicodeString::operator==((UnicodeString *)&j,&local_1e0);
      UnicodeString::~UnicodeString(&local_1e0);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffe18);
      if (UVar2 == '\0') {
        ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffd38,L"maxVariable");
        UnicodeString::UnicodeString
                  (&local_2c0,'\x01',(ConstChar16Ptr *)&stack0xfffffffffffffd38,-1);
        UVar2 = UnicodeString::operator==((UnicodeString *)&j,&local_2c0);
        UnicodeString::~UnicodeString(&local_2c0);
        ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffd38);
        if (UVar2 == '\0') {
          ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffbc8,L"caseFirst");
          UnicodeString::UnicodeString
                    (&local_430,'\x01',(ConstChar16Ptr *)&stack0xfffffffffffffbc8,-1);
          UVar2 = UnicodeString::operator==((UnicodeString *)&j,&local_430);
          UnicodeString::~UnicodeString(&local_430);
          ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffbc8);
          if (UVar2 == '\0') {
            ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffaa0,L"caseLevel");
            UnicodeString::UnicodeString
                      (&local_558,'\x01',(ConstChar16Ptr *)&stack0xfffffffffffffaa0,-1);
            UVar2 = UnicodeString::operator==((UnicodeString *)&j,&local_558);
            UnicodeString::~UnicodeString(&local_558);
            ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffaa0);
            if (UVar2 == '\0') {
              ConstChar16Ptr::ConstChar16Ptr
                        ((ConstChar16Ptr *)&stack0xfffffffffffffa50,L"normalization");
              UnicodeString::UnicodeString
                        (&local_5a8,'\x01',(ConstChar16Ptr *)&stack0xfffffffffffffa50,-1);
              UVar2 = UnicodeString::operator==((UnicodeString *)&j,&local_5a8);
              UnicodeString::~UnicodeString(&local_5a8);
              ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffa50);
              if (UVar2 == '\0') {
                ConstChar16Ptr::ConstChar16Ptr
                          ((ConstChar16Ptr *)&stack0xfffffffffffffa00,L"numericOrdering");
                UnicodeString::UnicodeString
                          (&local_5f8,'\x01',(ConstChar16Ptr *)&stack0xfffffffffffffa00,-1);
                UVar2 = UnicodeString::operator==((UnicodeString *)&j,&local_5f8);
                UnicodeString::~UnicodeString(&local_5f8);
                ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffa00);
                if (UVar2 == '\0') {
                  ConstChar16Ptr::ConstChar16Ptr
                            ((ConstChar16Ptr *)&stack0xfffffffffffff9b0,L"hiraganaQ");
                  UnicodeString::UnicodeString
                            (&local_648,'\x01',(ConstChar16Ptr *)&stack0xfffffffffffff9b0,-1);
                  UVar2 = UnicodeString::operator==((UnicodeString *)&j,&local_648);
                  UnicodeString::~UnicodeString(&local_648);
                  ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffff9b0);
                  if (UVar2 == '\0') {
                    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&lang.len,L"import");
                    UnicodeString::UnicodeString(&local_698,'\x01',(ConstChar16Ptr *)&lang.len,-1);
                    UVar2 = UnicodeString::operator==((UnicodeString *)&j,&local_698);
                    UnicodeString::~UnicodeString(&local_698);
                    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&lang.len);
                    if (UVar2 != '\0') {
                      CharString::CharString((CharString *)local_6e0);
                      CharString::appendInvariantChars
                                ((CharString *)local_6e0,(UnicodeString *)local_148,
                                 (UErrorCode *)raw.fUnion._48_8_);
                      if (*(int *)raw.fUnion._48_8_ == 7) {
                        local_bc = 1;
                      }
                      else {
                        langtag = CharString::data((CharString *)local_6e0);
                        iVar4 = uloc_forLanguageTag_63
                                          (langtag,(char *)&length,0x9d,&local_78c,
                                           (UErrorCode *)raw.fUnion._48_8_);
                        UVar2 = ::U_FAILURE(*(UErrorCode *)raw.fUnion._48_8_);
                        if (((UVar2 == '\0') &&
                            (iVar6 = CharString::length((CharString *)local_6e0), local_78c == iVar6
                            )) && (iVar4 < 0x9d)) {
                          iVar4 = uloc_getBaseName_63((char *)&length,collationType + 0x58,0x9d,
                                                      (UErrorCode *)raw.fUnion._48_8_);
                          UVar2 = ::U_FAILURE(*(UErrorCode *)raw.fUnion._48_8_);
                          if ((UVar2 == '\0') && (iVar4 < 0x60)) {
                            if ((iVar4 == 3) &&
                               (iVar7 = memcmp(collationType + 0x58,"und",3), iVar7 == 0)) {
                              strcpy(collationType + 0x58,"root");
                            }
                            iVar4 = uloc_getKeywordValue_63
                                              ((char *)&length,"collation",
                                               (char *)(importedRules.fUnion.fStackFields.fBuffer +
                                                       0x17),0x60,(UErrorCode *)raw.fUnion._48_8_);
                            UVar2 = ::U_FAILURE(*(UErrorCode *)raw.fUnion._48_8_);
                            if ((UVar2 == '\0') && (iVar4 < 0x60)) {
                              if (this->importer == (Importer *)0x0) {
                                setParseError(this,"[import langTag] is not supported",
                                              (UErrorCode *)raw.fUnion._48_8_);
                              }
                              else {
                                UnicodeString::UnicodeString((UnicodeString *)&outerRules);
                                if (iVar4 < 1) {
                                  local_a80 = "standard";
                                }
                                else {
                                  local_a80 = (char *)((long)&importedRules.fUnion + 0x30);
                                }
                                (*(this->importer->super_UObject)._vptr_UObject[3])
                                          (this->importer,collationType + 0x58,local_a80,&outerRules
                                           ,&this->errorReason,raw.fUnion._48_8_);
                                UVar2 = ::U_FAILURE(*(UErrorCode *)raw.fUnion._48_8_);
                                if (UVar2 == '\0') {
                                  pUVar1 = this->rules;
                                  set._84_4_ = this->ruleIndex;
                                  parse(this,(UnicodeString *)&outerRules,
                                        (UErrorCode *)raw.fUnion._48_8_);
                                  UVar2 = ::U_FAILURE(*(UErrorCode *)raw.fUnion._48_8_);
                                  if ((UVar2 != '\0') && (this->parseError != (UParseError *)0x0)) {
                                    this->parseError->offset = set._84_4_;
                                  }
                                  this->rules = pUVar1;
                                  this->ruleIndex = local_60;
                                  local_bc = 0;
                                }
                                else {
                                  if (this->errorReason == (char *)0x0) {
                                    this->errorReason = "[import langTag] failed";
                                  }
                                  setErrorContext(this);
                                  local_bc = 1;
                                }
                                UnicodeString::~UnicodeString((UnicodeString *)&outerRules);
                                if (local_bc != 0) goto LAB_00299488;
                              }
                              local_bc = 1;
                            }
                            else {
                              *(undefined4 *)raw.fUnion._48_8_ = 0;
                              setParseError(this,"expected language tag in [import langTag]",
                                            (UErrorCode *)raw.fUnion._48_8_);
                              local_bc = 1;
                            }
                          }
                          else {
                            *(undefined4 *)raw.fUnion._48_8_ = 0;
                            setParseError(this,"expected language tag in [import langTag]",
                                          (UErrorCode *)raw.fUnion._48_8_);
                            local_bc = 1;
                          }
                        }
                        else {
                          *(undefined4 *)raw.fUnion._48_8_ = 0;
                          setParseError(this,"expected language tag in [import langTag]",
                                        (UErrorCode *)raw.fUnion._48_8_);
                          local_bc = 1;
                        }
                      }
LAB_00299488:
                      CharString::~CharString((CharString *)local_6e0);
                      goto LAB_002994be;
                    }
                  }
                  else {
                    local_654 = getOnOffValue((UnicodeString *)local_148);
                    if (local_654 != UCOL_DEFAULT) {
                      if (local_654 == UCOL_ON) {
                        setParseError(this,"[hiraganaQ on] is not supported",
                                      (UErrorCode *)raw.fUnion._48_8_);
                      }
                      this->ruleIndex = local_60;
                      local_bc = 1;
                      goto LAB_002994be;
                    }
                  }
                }
                else {
                  local_604 = getOnOffValue((UnicodeString *)local_148);
                  if (local_604 != UCOL_DEFAULT) {
                    CollationSettings::setFlag
                              (this->settings,2,local_604,0,(UErrorCode *)raw.fUnion._48_8_);
                    this->ruleIndex = local_60;
                    local_bc = 1;
                    goto LAB_002994be;
                  }
                }
              }
              else {
                local_5b4 = getOnOffValue((UnicodeString *)local_148);
                if (local_5b4 != UCOL_DEFAULT) {
                  CollationSettings::setFlag
                            (this->settings,1,local_5b4,0,(UErrorCode *)raw.fUnion._48_8_);
                  this->ruleIndex = local_60;
                  local_bc = 1;
                  goto LAB_002994be;
                }
              }
            }
            else {
              local_564 = getOnOffValue((UnicodeString *)local_148);
              if (local_564 != UCOL_DEFAULT) {
                CollationSettings::setFlag
                          (this->settings,0x400,local_564,0,(UErrorCode *)raw.fUnion._48_8_);
                this->ruleIndex = local_60;
                local_bc = 1;
                goto LAB_002994be;
              }
            }
          }
          else {
            local_43c = UCOL_DEFAULT;
            ConstChar16Ptr::ConstChar16Ptr(&local_488,L"off");
            UnicodeString::UnicodeString(&local_480,'\x01',&local_488,-1);
            UVar2 = UnicodeString::operator==((UnicodeString *)local_148,&local_480);
            UnicodeString::~UnicodeString(&local_480);
            ConstChar16Ptr::~ConstChar16Ptr(&local_488);
            if (UVar2 == '\0') {
              ConstChar16Ptr::ConstChar16Ptr(&local_4d0,L"lower");
              UnicodeString::UnicodeString(&local_4c8,'\x01',&local_4d0,-1);
              UVar2 = UnicodeString::operator==((UnicodeString *)local_148,&local_4c8);
              UnicodeString::~UnicodeString(&local_4c8);
              ConstChar16Ptr::~ConstChar16Ptr(&local_4d0);
              if (UVar2 == '\0') {
                ConstChar16Ptr::ConstChar16Ptr(&local_518,L"upper");
                UnicodeString::UnicodeString(&local_510,'\x01',&local_518,-1);
                UVar2 = UnicodeString::operator==((UnicodeString *)local_148,&local_510);
                UnicodeString::~UnicodeString(&local_510);
                ConstChar16Ptr::~ConstChar16Ptr(&local_518);
                if (UVar2 != '\0') {
                  local_43c = UCOL_UPPER_FIRST;
                }
              }
              else {
                local_43c = UCOL_LOWER_FIRST;
              }
            }
            else {
              local_43c = UCOL_OFF;
            }
            if (local_43c != UCOL_DEFAULT) {
              CollationSettings::setCaseFirst
                        (this->settings,local_43c,0,(UErrorCode *)raw.fUnion._48_8_);
              this->ruleIndex = local_60;
              local_bc = 1;
              goto LAB_002994be;
            }
          }
        }
        else {
          local_2cc = -1;
          ConstChar16Ptr::ConstChar16Ptr(&local_318,L"space");
          UnicodeString::UnicodeString(&local_310,'\x01',&local_318,-1);
          UVar2 = UnicodeString::operator==((UnicodeString *)local_148,&local_310);
          UnicodeString::~UnicodeString(&local_310);
          ConstChar16Ptr::~ConstChar16Ptr(&local_318);
          if (UVar2 == '\0') {
            ConstChar16Ptr::ConstChar16Ptr(&local_360,L"punct");
            UnicodeString::UnicodeString(&local_358,'\x01',&local_360,-1);
            UVar2 = UnicodeString::operator==((UnicodeString *)local_148,&local_358);
            UnicodeString::~UnicodeString(&local_358);
            ConstChar16Ptr::~ConstChar16Ptr(&local_360);
            if (UVar2 == '\0') {
              ConstChar16Ptr::ConstChar16Ptr(&local_3a8,L"symbol");
              UnicodeString::UnicodeString(&local_3a0,'\x01',&local_3a8,-1);
              UVar2 = UnicodeString::operator==((UnicodeString *)local_148,&local_3a0);
              UnicodeString::~UnicodeString(&local_3a0);
              ConstChar16Ptr::~ConstChar16Ptr(&local_3a8);
              if (UVar2 == '\0') {
                ConstChar16Ptr::ConstChar16Ptr(&local_3f0,L"currency");
                UnicodeString::UnicodeString(&local_3e8,'\x01',&local_3f0,-1);
                UVar2 = UnicodeString::operator==((UnicodeString *)local_148,&local_3e8);
                UnicodeString::~UnicodeString(&local_3e8);
                ConstChar16Ptr::~ConstChar16Ptr(&local_3f0);
                if (UVar2 != '\0') {
                  local_2cc = 3;
                }
              }
              else {
                local_2cc = 2;
              }
            }
            else {
              local_2cc = 1;
            }
          }
          else {
            local_2cc = 0;
          }
          if (local_2cc != -1) {
            CollationSettings::setMaxVariable
                      (this->settings,local_2cc,0,(UErrorCode *)raw.fUnion._48_8_);
            uVar5 = CollationData::getLastPrimaryForGroup(this->baseData,local_2cc + 0x1000);
            this->settings->variableTop = uVar5;
            this->ruleIndex = local_60;
            local_bc = 1;
            goto LAB_002994be;
          }
        }
      }
      else {
        local_1ec = UCOL_DEFAULT;
        ConstChar16Ptr::ConstChar16Ptr(&local_238,L"non-ignorable");
        UnicodeString::UnicodeString(&local_230,'\x01',&local_238,-1);
        UVar2 = UnicodeString::operator==((UnicodeString *)local_148,&local_230);
        UnicodeString::~UnicodeString(&local_230);
        ConstChar16Ptr::~ConstChar16Ptr(&local_238);
        if (UVar2 == '\0') {
          ConstChar16Ptr::ConstChar16Ptr(&local_280,L"shifted");
          UnicodeString::UnicodeString(&local_278,'\x01',&local_280,-1);
          UVar2 = UnicodeString::operator==((UnicodeString *)local_148,&local_278);
          UnicodeString::~UnicodeString(&local_278);
          ConstChar16Ptr::~ConstChar16Ptr(&local_280);
          if (UVar2 != '\0') {
            local_1ec = UCOL_SHIFTED;
          }
        }
        else {
          local_1ec = UCOL_NON_IGNORABLE;
        }
        if (local_1ec != UCOL_DEFAULT) {
          CollationSettings::setAlternateHandling
                    (this->settings,local_1ec,0,(UErrorCode *)raw.fUnion._48_8_);
          this->ruleIndex = local_60;
          local_bc = 1;
          goto LAB_002994be;
        }
      }
LAB_002994b4:
      local_bc = 0;
    }
LAB_002994be:
    UnicodeString::~UnicodeString((UnicodeString *)local_148);
joined_r0x002997dd:
    if (local_bc != 0) goto LAB_00299816;
  }
  else {
    cVar3 = UnicodeString::charAt(this->rules,local_60);
    if (cVar3 == L'[') {
      UnicodeSet::UnicodeSet((UnicodeSet *)local_940);
      local_60 = parseUnicodeSet(this,local_60,(UnicodeSet *)local_940,
                                 (UErrorCode *)raw.fUnion._48_8_);
      UVar2 = ::U_FAILURE(*(UErrorCode *)raw.fUnion._48_8_);
      if (UVar2 == '\0') {
        ConstChar16Ptr::ConstChar16Ptr(&local_988,L"optimize");
        UnicodeString::UnicodeString(&local_980,'\x01',&local_988,-1);
        UVar2 = UnicodeString::operator==((UnicodeString *)&j,&local_980);
        UnicodeString::~UnicodeString(&local_980);
        ConstChar16Ptr::~ConstChar16Ptr(&local_988);
        if (UVar2 == '\0') {
          ConstChar16Ptr::ConstChar16Ptr(&local_9d0,L"suppressContractions");
          UnicodeString::UnicodeString(&local_9c8,'\x01',&local_9d0,-1);
          UVar2 = UnicodeString::operator==((UnicodeString *)&j,&local_9c8);
          UnicodeString::~UnicodeString(&local_9c8);
          ConstChar16Ptr::~ConstChar16Ptr(&local_9d0);
          if (UVar2 == '\0') {
            local_bc = 0;
          }
          else {
            (*(this->sink->super_UObject)._vptr_UObject[5])
                      (this->sink,local_940,&this->errorReason,raw.fUnion._48_8_);
            UVar2 = ::U_FAILURE(*(UErrorCode *)raw.fUnion._48_8_);
            if (UVar2 != '\0') {
              setErrorContext(this);
            }
            this->ruleIndex = local_60;
            local_bc = 1;
          }
        }
        else {
          (*(this->sink->super_UObject)._vptr_UObject[6])
                    (this->sink,local_940,&this->errorReason,raw.fUnion._48_8_);
          UVar2 = ::U_FAILURE(*(UErrorCode *)raw.fUnion._48_8_);
          if (UVar2 != '\0') {
            setErrorContext(this);
          }
          this->ruleIndex = local_60;
          local_bc = 1;
        }
      }
      else {
        local_bc = 1;
      }
      UnicodeSet::~UnicodeSet((UnicodeSet *)local_940);
      goto joined_r0x002997dd;
    }
  }
  setParseError(this,"not a valid setting/option",(UErrorCode *)raw.fUnion._48_8_);
  local_bc = 0;
LAB_00299816:
  UnicodeString::~UnicodeString((UnicodeString *)&j);
  return;
}

Assistant:

void
CollationRuleParser::parseSetting(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    UnicodeString raw;
    int32_t i = ruleIndex + 1;
    int32_t j = readWords(i, raw);
    if(j <= i || raw.isEmpty()) {
        setParseError("expected a setting/option at '['", errorCode);
    }
    if(rules->charAt(j) == 0x5d) {  // words end with ]
        ++j;
        if(raw.startsWith(UNICODE_STRING_SIMPLE("reorder")) &&
                (raw.length() == 7 || raw.charAt(7) == 0x20)) {
            parseReordering(raw, errorCode);
            ruleIndex = j;
            return;
        }
        if(raw == UNICODE_STRING_SIMPLE("backwards 2")) {
            settings->setFlag(CollationSettings::BACKWARD_SECONDARY,
                              UCOL_ON, 0, errorCode);
            ruleIndex = j;
            return;
        }
        UnicodeString v;
        int32_t valueIndex = raw.lastIndexOf((UChar)0x20);
        if(valueIndex >= 0) {
            v.setTo(raw, valueIndex + 1);
            raw.truncate(valueIndex);
        }
        if(raw == UNICODE_STRING_SIMPLE("strength") && v.length() == 1) {
            int32_t value = UCOL_DEFAULT;
            UChar c = v.charAt(0);
            if(0x31 <= c && c <= 0x34) {  // 1..4
                value = UCOL_PRIMARY + (c - 0x31);
            } else if(c == 0x49) {  // 'I'
                value = UCOL_IDENTICAL;
            }
            if(value != UCOL_DEFAULT) {
                settings->setStrength(value, 0, errorCode);
                ruleIndex = j;
                return;
            }
        } else if(raw == UNICODE_STRING_SIMPLE("alternate")) {
            UColAttributeValue value = UCOL_DEFAULT;
            if(v == UNICODE_STRING_SIMPLE("non-ignorable")) {
                value = UCOL_NON_IGNORABLE;
            } else if(v == UNICODE_STRING_SIMPLE("shifted")) {
                value = UCOL_SHIFTED;
            }
            if(value != UCOL_DEFAULT) {
                settings->setAlternateHandling(value, 0, errorCode);
                ruleIndex = j;
                return;
            }
        } else if(raw == UNICODE_STRING_SIMPLE("maxVariable")) {
            int32_t value = UCOL_DEFAULT;
            if(v == UNICODE_STRING_SIMPLE("space")) {
                value = CollationSettings::MAX_VAR_SPACE;
            } else if(v == UNICODE_STRING_SIMPLE("punct")) {
                value = CollationSettings::MAX_VAR_PUNCT;
            } else if(v == UNICODE_STRING_SIMPLE("symbol")) {
                value = CollationSettings::MAX_VAR_SYMBOL;
            } else if(v == UNICODE_STRING_SIMPLE("currency")) {
                value = CollationSettings::MAX_VAR_CURRENCY;
            }
            if(value != UCOL_DEFAULT) {
                settings->setMaxVariable(value, 0, errorCode);
                settings->variableTop = baseData->getLastPrimaryForGroup(
                    UCOL_REORDER_CODE_FIRST + value);
                U_ASSERT(settings->variableTop != 0);
                ruleIndex = j;
                return;
            }
        } else if(raw == UNICODE_STRING_SIMPLE("caseFirst")) {
            UColAttributeValue value = UCOL_DEFAULT;
            if(v == UNICODE_STRING_SIMPLE("off")) {
                value = UCOL_OFF;
            } else if(v == UNICODE_STRING_SIMPLE("lower")) {
                value = UCOL_LOWER_FIRST;
            } else if(v == UNICODE_STRING_SIMPLE("upper")) {
                value = UCOL_UPPER_FIRST;
            }
            if(value != UCOL_DEFAULT) {
                settings->setCaseFirst(value, 0, errorCode);
                ruleIndex = j;
                return;
            }
        } else if(raw == UNICODE_STRING_SIMPLE("caseLevel")) {
            UColAttributeValue value = getOnOffValue(v);
            if(value != UCOL_DEFAULT) {
                settings->setFlag(CollationSettings::CASE_LEVEL, value, 0, errorCode);
                ruleIndex = j;
                return;
            }
        } else if(raw == UNICODE_STRING_SIMPLE("normalization")) {
            UColAttributeValue value = getOnOffValue(v);
            if(value != UCOL_DEFAULT) {
                settings->setFlag(CollationSettings::CHECK_FCD, value, 0, errorCode);
                ruleIndex = j;
                return;
            }
        } else if(raw == UNICODE_STRING_SIMPLE("numericOrdering")) {
            UColAttributeValue value = getOnOffValue(v);
            if(value != UCOL_DEFAULT) {
                settings->setFlag(CollationSettings::NUMERIC, value, 0, errorCode);
                ruleIndex = j;
                return;
            }
        } else if(raw == UNICODE_STRING_SIMPLE("hiraganaQ")) {
            UColAttributeValue value = getOnOffValue(v);
            if(value != UCOL_DEFAULT) {
                if(value == UCOL_ON) {
                    setParseError("[hiraganaQ on] is not supported", errorCode);
                }
                ruleIndex = j;
                return;
            }
        } else if(raw == UNICODE_STRING_SIMPLE("import")) {
            CharString lang;
            lang.appendInvariantChars(v, errorCode);
            if(errorCode == U_MEMORY_ALLOCATION_ERROR) { return; }
            // BCP 47 language tag -> ICU locale ID
            char localeID[ULOC_FULLNAME_CAPACITY];
            int32_t parsedLength;
            int32_t length = uloc_forLanguageTag(lang.data(), localeID, ULOC_FULLNAME_CAPACITY,
                                                 &parsedLength, &errorCode);
            if(U_FAILURE(errorCode) ||
                    parsedLength != lang.length() || length >= ULOC_FULLNAME_CAPACITY) {
                errorCode = U_ZERO_ERROR;
                setParseError("expected language tag in [import langTag]", errorCode);
                return;
            }
            // localeID minus all keywords
            char baseID[ULOC_FULLNAME_CAPACITY];
            length = uloc_getBaseName(localeID, baseID, ULOC_FULLNAME_CAPACITY, &errorCode);
            if(U_FAILURE(errorCode) || length >= ULOC_KEYWORDS_CAPACITY) {
                errorCode = U_ZERO_ERROR;
                setParseError("expected language tag in [import langTag]", errorCode);
                return;
            }
            if(length == 3 && uprv_memcmp(baseID, "und", 3) == 0) {
                uprv_strcpy(baseID, "root");
            }
            // @collation=type, or length=0 if not specified
            char collationType[ULOC_KEYWORDS_CAPACITY];
            length = uloc_getKeywordValue(localeID, "collation",
                                          collationType, ULOC_KEYWORDS_CAPACITY,
                                          &errorCode);
            if(U_FAILURE(errorCode) || length >= ULOC_KEYWORDS_CAPACITY) {
                errorCode = U_ZERO_ERROR;
                setParseError("expected language tag in [import langTag]", errorCode);
                return;
            }
            if(importer == NULL) {
                setParseError("[import langTag] is not supported", errorCode);
            } else {
                UnicodeString importedRules;
                importer->getRules(baseID, length > 0 ? collationType : "standard",
                                   importedRules, errorReason, errorCode);
                if(U_FAILURE(errorCode)) {
                    if(errorReason == NULL) {
                        errorReason = "[import langTag] failed";
                    }
                    setErrorContext();
                    return;
                }
                const UnicodeString *outerRules = rules;
                int32_t outerRuleIndex = ruleIndex;
                parse(importedRules, errorCode);
                if(U_FAILURE(errorCode)) {
                    if(parseError != NULL) {
                        parseError->offset = outerRuleIndex;
                    }
                }
                rules = outerRules;
                ruleIndex = j;
            }
            return;
        }
    } else if(rules->charAt(j) == 0x5b) {  // words end with [
        UnicodeSet set;
        j = parseUnicodeSet(j, set, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(raw == UNICODE_STRING_SIMPLE("optimize")) {
            sink->optimize(set, errorReason, errorCode);
            if(U_FAILURE(errorCode)) { setErrorContext(); }
            ruleIndex = j;
            return;
        } else if(raw == UNICODE_STRING_SIMPLE("suppressContractions")) {
            sink->suppressContractions(set, errorReason, errorCode);
            if(U_FAILURE(errorCode)) { setErrorContext(); }
            ruleIndex = j;
            return;
        }
    }
    setParseError("not a valid setting/option", errorCode);
}